

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O0

ans_reorder_fold_decode<3U> * ans_reorder_fold_decode<3U>::load(uint8_t *in_u8)

{
  uint uVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint16_t uVar2;
  int iVar3;
  uint32_t uVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  uint64_t uVar8;
  int *in_RSI;
  ans_reorder_fold_decode<3U> *in_RDI;
  undefined1 auVar9 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [64];
  uint32_t k;
  uint32_t mapped_num;
  uint32_t except_bytes;
  value_type cur_freq;
  size_t sym;
  uint32_t cur_base;
  uint64_t tmp;
  size_type max_sym;
  size_t i_1;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> most_frequent;
  size_t no_except_thres;
  uint32_t do_reorder;
  uint32_t *in_ptr_u32;
  ans_reorder_fold_decode<3U> *model;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef0;
  uint16_t in_stack_fffffffffffffef6;
  undefined4 in_stack_fffffffffffffef8;
  uint32_t uVar11;
  undefined2 in_stack_fffffffffffffefc;
  undefined2 in_stack_fffffffffffffefe;
  uint32_t in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff04;
  size_type in_stack_ffffffffffffff08;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *most_frequent_00;
  value_type in_stack_ffffffffffffff10;
  value_type in_stack_ffffffffffffff14;
  uint local_c8;
  ulong local_b8;
  int local_ac;
  pointer in_stack_ffffffffffffff78;
  size_type local_70;
  size_type local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  ulong local_30;
  int local_24;
  value_type *local_20;
  byte local_11;
  int *local_10;
  undefined1 extraout_var [56];
  
  local_11 = 0;
  local_10 = in_RSI;
  ans_reorder_fold_decode
            ((ans_reorder_fold_decode<3U> *)
             CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0));
  local_20 = (value_type *)(local_10 + 1);
  local_24 = *local_10;
  local_30 = 0x400;
  local_10 = local_10 + 1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x21c880);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
             ,(allocator_type *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x21c8a6);
  if (local_24 == 1) {
    for (local_68 = 0; auVar9 = in_ZMM0._0_16_, local_68 < local_30; local_68 = local_68 + 1) {
      in_stack_ffffffffffffff14 = *local_20;
      local_20 = local_20 + 1;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_48,local_68);
      *pvVar5 = in_stack_ffffffffffffff14;
    }
    local_10 = local_10 + local_30;
  }
  else {
    for (local_70 = 0; auVar9 = in_ZMM0._0_16_, local_70 < local_30; local_70 = local_70 + 1) {
      in_stack_ffffffffffffff10 = (value_type)local_70;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_48,local_70);
      *pvVar5 = in_stack_ffffffffffffff10;
    }
  }
  ans_load_interp((uint8_t *)in_stack_ffffffffffffff78);
  most_frequent_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffff78
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT26(in_stack_fffffffffffffefe,
                      CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffee8._M_current);
  std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffee8._M_current);
  __first._M_current._6_2_ = in_stack_fffffffffffffef6;
  __first._M_current._0_6_ = in_stack_fffffffffffffef0;
  iVar3 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    (__first,in_stack_fffffffffffffee8,0);
  in_RDI->frame_size = (long)iVar3;
  in_RDI->frame_mask = in_RDI->frame_size - 1;
  auVar9 = vcvtusi2sd_avx512f(auVar9,in_RDI->frame_size);
  auVar10._0_8_ = log2(auVar9._0_8_);
  auVar10._8_56_ = extraout_var;
  uVar8 = vcvttsd2usi_avx512f(auVar10._0_16_);
  in_RDI->frame_log2 = uVar8;
  std::vector<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>::resize
            ((vector<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (size_type)most_frequent_00);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->nfreqs);
  local_ac = 0;
  for (local_b8 = 0; local_b8 <= sVar6 - 1; local_b8 = local_b8 + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->nfreqs,local_b8);
    uVar1 = *pvVar5;
    uVar4 = ans_reorder_fold_exception_bytes<3u>((uint32_t)local_b8);
    in_stack_ffffffffffffff04 = uVar4;
    in_stack_ffffffffffffff00 = ans_reorder_fold_undo_mapping<3u>(most_frequent_00,uVar4);
    uVar4 = in_stack_ffffffffffffff00 + uVar4 * 0x40000000;
    for (local_c8 = 0; local_c8 < uVar1; local_c8 = local_c8 + 1) {
      in_stack_fffffffffffffef6 = (uint16_t)uVar1;
      pvVar7 = std::vector<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>::
               operator[](&in_RDI->table,(ulong)(local_ac + local_c8));
      pvVar7->freq = in_stack_fffffffffffffef6;
      uVar11 = uVar4;
      pvVar7 = std::vector<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>::
               operator[](&in_RDI->table,(ulong)(local_ac + local_c8));
      pvVar7->mapped_num = uVar11;
      uVar2 = (uint16_t)local_c8;
      pvVar7 = std::vector<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>::
               operator[](&in_RDI->table,(ulong)(local_ac + local_c8));
      pvVar7->offset = uVar2;
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->nfreqs,local_b8);
    local_ac = *pvVar5 + local_ac;
  }
  in_RDI->lower_bound = in_RDI->frame_size << 4;
  local_11 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  if ((local_11 & 1) == 0) {
    ~ans_reorder_fold_decode
              ((ans_reorder_fold_decode<3U> *)
               CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0));
  }
  return in_RDI;
}

Assistant:

static ans_reorder_fold_decode load(const uint8_t* in_u8)
    {
        ans_reorder_fold_decode model;
        auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
        in_u8 += sizeof(uint32_t);
        uint32_t do_reorder = *in_ptr_u32++;
        size_t no_except_thres = 1 << (fidelity + 8 - 1);
        std::vector<uint32_t> most_frequent(no_except_thres);
        if (do_reorder == 1) {
            for (size_t i = 0; i < no_except_thres; i++) {
                most_frequent[i] = *in_ptr_u32++;
            }
            in_u8 += no_except_thres * sizeof(uint32_t);
        } else {
            for (size_t i = 0; i < no_except_thres; i++) {
                most_frequent[i] = i;
            }
        }

        model.nfreqs = ans_load_interp(in_u8);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            uint32_t except_bytes
                = ans_reorder_fold_exception_bytes<fidelity>(sym);
            uint32_t mapped_num
                = ans_reorder_fold_undo_mapping<fidelity>(most_frequent, sym)
                + (except_bytes << 30);
            for (uint32_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                model.table[cur_base + k].mapped_num = mapped_num;
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }